

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.cpp
# Opt level: O0

bool __thiscall
Diligent::anon_unknown_25::ArchiveSerializer<(Diligent::SerializerMode)0>::SerializeShaders
          (ArchiveSerializer<(Diligent::SerializerMode)0> *this,ShadersVector *Shaders)

{
  vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_> *this_00;
  bool bVar1;
  reference Data;
  SerializedData *Shader;
  iterator __end2;
  iterator __begin2;
  ShadersVector *__range2;
  ShadersVector *pSStack_20;
  Uint32 NumShaders;
  ShadersVector *Shaders_local;
  ArchiveSerializer<(Diligent::SerializerMode)0> *this_local;
  
  __range2._4_4_ = 0;
  pSStack_20 = Shaders;
  Shaders_local = (ShadersVector *)this;
  bVar1 = Serializer<(Diligent::SerializerMode)0>::operator()
                    (this->Ser,(uint *)((long)&__range2 + 4));
  if (bVar1) {
    std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>::resize
              (pSStack_20,(ulong)__range2._4_4_);
    this_00 = pSStack_20;
    __end2 = std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>::begin
                       (pSStack_20);
    Shader = (SerializedData *)
             std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>::end
                       (this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Diligent::SerializedData_*,_std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>_>
                                       *)&Shader), bVar1) {
      Data = __gnu_cxx::
             __normal_iterator<Diligent::SerializedData_*,_std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>_>
             ::operator*(&__end2);
      bVar1 = Serializer<(Diligent::SerializerMode)0>::Serialize(this->Ser,Data);
      if (!bVar1) {
        return false;
      }
      __gnu_cxx::
      __normal_iterator<Diligent::SerializedData_*,_std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>_>
      ::operator++(&__end2);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ArchiveSerializer<SerializerMode::Read>::SerializeShaders(ShadersVector& Shaders) const
{
    Uint32 NumShaders = 0;
    if (!Ser(NumShaders))
        return false;

    Shaders.resize(NumShaders);
    for (auto& Shader : Shaders)
    {
        if (!Ser.Serialize(Shader))
            return false;
    }

    return true;
}